

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

void __thiscall cmSearchPath::AddUserPath(cmSearchPath *this,string *path)

{
  bool bVar1;
  bool bVar2;
  char *base;
  string *path_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outPaths;
  string expanded;
  
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSearchPath.cxx"
                  ,0x39,"void cmSearchPath::AddUserPath(const std::string &)");
  }
  outPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outPaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cmMakefile::PlatformIs64Bit((this->FC->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&expanded,(string *)path);
  cmSystemTools::ExpandRegistryValues(&expanded,bVar1 + KeyWOW64_32);
  cmSystemTools::GlobDirs(&expanded,&outPaths);
  bVar2 = std::operator!=(&expanded,path);
  path_00 = outPaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((bVar2) &&
     (bVar2 = std::operator==(&this->FC->CMakePathName,"PROGRAM"),
     path_00 = outPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, bVar2)) {
    std::__cxx11::string::_M_assign((string *)&expanded);
    cmSystemTools::ExpandRegistryValues(&expanded,KeyWOW64_64 - bVar1);
    cmSystemTools::GlobDirs(&expanded,&outPaths);
    path_00 = outPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; path_00 !=
         outPaths.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish; path_00 = path_00 + 1) {
    base = cmMakefile::GetCurrentSourceDirectory((this->FC->super_cmCommand).Makefile);
    AddPathInternal(this,path_00,base);
  }
  std::__cxx11::string::~string((string *)&expanded);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outPaths);
  return;
}

Assistant:

void cmSearchPath::AddUserPath(const std::string& path)
{
  assert(this->FC != NULL);

  std::vector<std::string> outPaths;

  // We should view the registry as the target application would view
  // it.
  cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
  cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
  if(this->FC->Makefile->PlatformIs64Bit())
    {
    view = cmSystemTools::KeyWOW64_64;
    other_view = cmSystemTools::KeyWOW64_32;
    }

  // Expand using the view of the target application.
  std::string expanded = path;
  cmSystemTools::ExpandRegistryValues(expanded, view);
  cmSystemTools::GlobDirs(expanded, outPaths);

  // Executables can be either 32-bit or 64-bit, so expand using the
  // alternative view.
  if(expanded != path && this->FC->CMakePathName == "PROGRAM")
    {
    expanded = path;
    cmSystemTools::ExpandRegistryValues(expanded, other_view);
    cmSystemTools::GlobDirs(expanded, outPaths);
    }

  // Process them all from the current directory
  for(std::vector<std::string>::const_iterator p = outPaths.begin();
      p != outPaths.end(); ++p)
    {
    this->AddPathInternal(*p, this->FC->Makefile->GetCurrentSourceDirectory());
    }
}